

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

UBool __thiscall
icu_63::OlsonTimeZone::getPreviousTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  short sVar1;
  TimeArrayTimeZoneRule **ppTVar2;
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int64_t iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimeZoneTransition *right;
  short transIdx;
  bool bVar8;
  UDate UVar9;
  UErrorCode status;
  UnicodeString toName;
  UnicodeString fromName;
  UErrorCode local_b4;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b4 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_b4);
  if (U_ZERO_ERROR < local_b4) {
    return '\0';
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    if (inclusive == '\0') {
LAB_001ebbfc:
      UVar9 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if (base <= UVar9) goto LAB_001ebc57;
      iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9]
              )();
      if ((char)iVar4 != '\0') {
        iVar4 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
                  _vptr_UObject[0xf])
                          (base,this->finalZoneWithStartYear,(ulong)(uint)(int)inclusive,result);
        return (UBool)iVar4;
      }
    }
    else {
      UVar9 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((UVar9 != base) || (NAN(UVar9) || NAN(base))) goto LAB_001ebbfc;
    }
    right = this->firstFinalTZTransition;
LAB_001ebcf6:
    TimeZoneTransition::operator=(result,right);
    return '\x01';
  }
LAB_001ebc57:
  ppTVar2 = this->historicRules;
  if (ppTVar2 == (TimeArrayTimeZoneRule **)0x0) {
    return '\0';
  }
  sVar1 = this->firstTZTransitionIdx;
  transIdx = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  do {
    transIdx = transIdx + -1;
    if (transIdx < sVar1) {
      return '\0';
    }
    iVar7 = transitionTimeInSeconds(this,transIdx);
  } while ((base <= (double)iVar7 * 1000.0) && (inclusive == '\0' || (double)iVar7 * 1000.0 != base)
          );
  if (sVar1 == transIdx) {
    right = this->firstTZTransition;
    goto LAB_001ebcf6;
  }
  this_00 = ppTVar2[this->typeMapData[transIdx]];
  this_01 = ppTVar2[this->typeMapData[(long)transIdx + -1]];
  iVar7 = transitionTimeInSeconds(this,transIdx);
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&this_01->super_TimeZoneRule,&local_70);
  TimeZoneRule::getName(&this_00->super_TimeZoneRule,&local_b0);
  if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
    if (-1 < local_70.fUnion.fStackFields.fLengthAndFlags) {
      local_70.fUnion.fFields.fLength = (int)local_70.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (-1 < local_b0.fUnion.fStackFields.fLengthAndFlags) {
      local_b0.fUnion.fFields.fLength = (int)local_b0.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if ((((int)local_b0.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
       (local_70.fUnion.fFields.fLength == local_b0.fUnion.fFields.fLength)) {
      UVar3 = UnicodeString::doEquals(&local_70,&local_b0,local_70.fUnion.fFields.fLength);
      bVar8 = UVar3 != '\0';
      goto LAB_001ebdd7;
    }
  }
  else {
    bVar8 = (bool)(local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
LAB_001ebdd7:
    if (bVar8 != false) {
      iVar5 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
      iVar6 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
      if (iVar5 == iVar6) {
        iVar5 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
        iVar6 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
        if (iVar5 == iVar6) {
          iVar4 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xf])
                            ((double)iVar7 * 1000.0,this,0,result);
          UVar3 = (UBool)iVar4;
          goto LAB_001ebe59;
        }
      }
    }
  }
  TimeZoneTransition::setTime(result,(double)iVar7 * 1000.0);
  iVar4 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_01);
  TimeZoneTransition::adoptFrom(result,(TimeZoneRule *)CONCAT44(extraout_var,iVar4));
  iVar4 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_00);
  UVar3 = '\x01';
  TimeZoneTransition::adoptTo(result,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar4));
LAB_001ebe59:
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return UVar3;
}

Assistant:

UBool
OlsonTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base > firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getPreviousTransition(base, inclusive, result);
                return finalZoneWithStartYear->getPreviousTransition(base, inclusive, result);
            } else {
                result = *firstFinalTZTransition;
                return TRUE;
            }
        }
    }

    if (historicRules != NULL) {
        // Find a historical transition
        int16_t ttidx = transitionCount() - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (inclusive && base == t)) {
                break;
            }
        }
        if (ttidx < firstTZTransitionIdx) {
            // No more transitions
            return FALSE;
        } else if (ttidx == firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx-1]];
            UDate startTime = (UDate)transitionTime(ttidx);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getPreviousTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}